

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk.cc
# Opt level: O2

void predict_or_learn<false>(topk *d,single_learner *base,multi_ex *ec_seq)

{
  pointer ppeVar1;
  pointer ppVar2;
  pointer ppeVar3;
  value_type local_6928;
  example ec;
  
  ppeVar3 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar1 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppeVar3 == ppeVar1) {
      return;
    }
    memcpy(&ec,*ppeVar3,0x68d0);
    LEARNER::learner<char,_example>::predict(base,&ec,0);
    ppVar2 = (d->pr_queue).c.
             super__Vector_base<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(d->pr_queue).c.
                       super__Vector_base<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2) / 0x28) <
        (ulong)d->K) {
LAB_001aeba2:
      local_6928.first = ec.pred.scalar;
      local_6928.second.end_array = ec.tag.end_array;
      local_6928.second.erase_count = ec.tag.erase_count;
      local_6928.second._begin = ec.tag._begin;
      local_6928.second._end = ec.tag._end;
      std::
      priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
      ::push(&d->pr_queue,&local_6928);
    }
    else if (ppVar2->first <= ec.pred.scalar && ec.pred.scalar != ppVar2->first) {
      std::
      priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
      ::pop(&d->pr_queue);
      goto LAB_001aeba2;
    }
    output_example(d->all,&ec);
    ppeVar3 = ppeVar3 + 1;
  } while( true );
}

Assistant:

void predict_or_learn(topk& d, LEARNER::single_learner& base, multi_ex& ec_seq)
{
  for (auto example : ec_seq)
  {
    auto ec = *example;

    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);

    if (d.pr_queue.size() < d.K)
      d.pr_queue.push(make_pair(ec.pred.scalar, ec.tag));
    else if (d.pr_queue.top().first < ec.pred.scalar)
    {
      d.pr_queue.pop();
      d.pr_queue.push(make_pair(ec.pred.scalar, ec.tag));
    }

    output_example(*d.all, ec);
  }
}